

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFFormFieldObjectHelper::getInheritableFieldValue(QPDFFormFieldObjectHelper *this,string *name)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar2;
  bool local_122;
  QPDFObjectHandle local_f0;
  allocator<char> local_d9;
  string local_d8 [32];
  QPDFObjectHandle local_b8;
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0;
  QPDFObjGen local_80;
  undefined1 local_78 [8];
  set seen;
  QPDFObjectHandle node;
  string *name_local;
  QPDFFormFieldObjectHelper *this_local;
  QPDFObjectHandle *result;
  
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffd0);
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  if (!bVar1) {
    QPDFObjectHandle::newNull();
    goto LAB_001df4bc;
  }
  seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
  super__Rb_tree_header._M_node_count._7_1_ = 0;
  QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)&stack0xffffffffffffffd0);
  bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
  if (bVar1) {
    QPDFObjGen::set::set((set *)local_78);
    do {
      local_a2 = 0;
      local_a3 = 0;
      local_80 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                           ((BaseHandle *)&stack0xffffffffffffffd0);
      bVar1 = QPDFObjGen::set::add((set *)local_78,local_80);
      local_122 = false;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_a2 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"/Parent",&local_a1);
        local_a3 = 1;
        local_122 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&stack0xffffffffffffffd0,&local_a0)
        ;
      }
      if ((local_a3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_a0);
      }
      if ((local_a2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_a1);
      }
      if (local_122 == false) {
        bVar1 = false;
        goto LAB_001df470;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_d8,"/Parent",&local_d9);
      QPDFObjectHandle::getKey(&local_b8,(string *)&stack0xffffffffffffffd0);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)&stack0xffffffffffffffd0,&local_b8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_b8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
      QPDFObjectHandle::getKey(&local_f0,(string *)&stack0xffffffffffffffd0);
      QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_f0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_f0);
      bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)this);
    } while (bVar1);
    QTC::TC("qpdf","QPDFFormFieldObjectHelper non-trivial inheritance",0);
    seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
    super__Rb_tree_header._M_node_count._7_1_ = 1;
    bVar1 = true;
LAB_001df470:
    QPDFObjGen::set::~set((set *)local_78);
    if (!bVar1) goto LAB_001df48f;
  }
  else {
LAB_001df48f:
    seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
    super__Rb_tree_header._M_node_count._7_1_ = 1;
  }
  if ((seen.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl.
       super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)this);
  }
LAB_001df4bc:
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFFormFieldObjectHelper::getInheritableFieldValue(std::string const& name)
{
    QPDFObjectHandle node = oh();
    if (!node.isDictionary()) {
        return QPDFObjectHandle::newNull();
    }
    QPDFObjectHandle result(node.getKey(name));
    if (result.isNull()) {
        QPDFObjGen::set seen;
        while (seen.add(node) && node.hasKey("/Parent")) {
            node = node.getKey("/Parent");
            result = node.getKey(name);
            if (!result.isNull()) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper non-trivial inheritance");
                return result;
            }
        }
    }
    return result;
}